

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiArea::childEvent(QMdiArea *this,QChildEvent *childEvent)

{
  QMdiAreaPrivate *this_00;
  qsizetype qVar1;
  long in_FS_OFFSET;
  QMdiSubWindow *mdiChild;
  QMdiSubWindow *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(childEvent + 8) == 0x45) {
    this_00 = *(QMdiAreaPrivate **)
               &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
    local_18 = (QMdiSubWindow *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
    if (local_18 != (QMdiSubWindow *)0x0) {
      qVar1 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                        (&this_00->childWindows,&local_18,0);
      if (qVar1 == -1) {
        QMdiAreaPrivate::appendChild(this_00,local_18);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::childEvent(QChildEvent *childEvent)
{
    Q_D(QMdiArea);
    if (childEvent->type() == QEvent::ChildPolished) {
        if (QMdiSubWindow *mdiChild = qobject_cast<QMdiSubWindow *>(childEvent->child())) {
            if (d->childWindows.indexOf(mdiChild) == -1)
                d->appendChild(mdiChild);
        }
    }
}